

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

uint arg_off(char *msg,uint idx)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int in_ESI;
  char *in_RDI;
  bool bVar8;
  char type;
  uint8_t *arg_pos;
  uint8_t *aligned_ptr;
  uint8_t *args;
  uint in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  cVar2 = rtosc_type(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  iVar3 = has_reserved(cVar2);
  if (iVar3 == 0) {
    local_4 = 0;
  }
  else {
    pcVar5 = rtosc_argument_string(in_RDI);
    pcVar7 = pcVar5;
    do {
      pcVar6 = pcVar7 + 1;
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar6;
    } while (*pcVar1 != '\0');
    pcVar6 = pcVar6 + (4 - ((long)pcVar6 - (long)(pcVar5 + -1)) % 4);
    while( true ) {
      bVar8 = true;
      if (*pcVar5 != '[') {
        bVar8 = *pcVar5 == ']';
      }
      if (!bVar8) break;
      pcVar5 = pcVar5 + 1;
    }
    while (iVar3 = in_ESI + -1, in_ESI != 0) {
      pcVar7 = pcVar5 + 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar7;
      if ((cVar2 != '[') && (cVar2 != ']')) {
        uVar4 = arg_size((uint8_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                         (char)((ulong)pcVar7 >> 0x38));
        pcVar6 = pcVar6 + uVar4;
        pcVar5 = pcVar7;
        in_ESI = iVar3;
      }
    }
    local_4 = (int)pcVar6 - (int)in_RDI;
  }
  return local_4;
}

Assistant:

static unsigned arg_off(const char *msg, unsigned idx)
{
    if(!has_reserved(rtosc_type(msg,idx)))
        return 0;

    //Iterate to the right position
    const uint8_t *args = (const uint8_t*) rtosc_argument_string(msg);
    const uint8_t *aligned_ptr = args-1;
    const uint8_t *arg_pos = args;

    while(*++arg_pos);
    //Alignment
    arg_pos += 4-(arg_pos-((uint8_t*)aligned_ptr))%4;

    //ignore any leading '[' or ']'
    while(*args == '[' || *args == ']')
        ++args;

    while(idx--) {
        char type = *args++;
        if(type == '[' || type == ']')
            idx++;//not a valid arg idx
        else
            arg_pos += arg_size(arg_pos, type);
    }
    return arg_pos-(uint8_t*)msg;
}